

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveFieldGenerator::GenerateBuilderMembers
          (ImmutablePrimitiveFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  bool bVar3;
  Options *pOVar4;
  string_view local_2a8;
  string_view local_298;
  string_view local_288;
  JavaType local_278;
  Semantic local_274;
  JavaType type;
  string_view local_268;
  string_view local_258;
  string_view local_248;
  Options local_238;
  Semantic local_1e4;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1e0;
  string_view local_1d8;
  string_view local_1c8;
  string_view local_1b8;
  Options local_1a8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_150;
  string_view local_148;
  string_view local_138;
  string_view local_128;
  Options local_118;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_c0;
  string_view local_b8;
  string_view local_a8;
  string_view local_98 [2];
  Options local_78;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutablePrimitiveFieldGenerator *this_local;
  
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,"private $field_type$ $name$_ $default_init$;\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&this->variables_,local_28);
  bVar3 = FieldDescriptor::has_presence(this->descriptor_);
  pPVar2 = local_18;
  if (bVar3) {
    pFVar1 = this->descriptor_;
    pOVar4 = Context::options(this->context_);
    java::Options::Options(&local_78,pOVar4);
    WriteFieldAccessorDocComment(pPVar2,pFVar1,HAZZER,&local_78,false,false,false);
    java::Options::~Options(&local_78);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (local_98,
               "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $get_has_field_bit_builder$;\n}\n"
              );
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_98[0]);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b8,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_c0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_a8,local_b8,pFVar1,local_c0);
  }
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_118,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,GETTER,&local_118,false,false,false);
  java::Options::~Options(&local_118);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,
             "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return $name$_;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_128);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_138,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_148,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_150);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_138,local_148,pFVar1,local_150);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_1a8,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,SETTER,&local_1a8,true,false,false);
  java::Options::~Options(&local_1a8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,
             "$deprecation$public Builder ${$set$capitalized_name$$}$($type$ value) {\n  $null_check$\n  $name$_ = value;\n  $set_has_field_bit_builder$\n  $on_changed$\n  return this;\n}\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_1b8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d8,"}");
  pFVar1 = this->descriptor_;
  local_1e4 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>(&local_1e0,&local_1e4);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_1c8,local_1d8,pFVar1,local_1e0);
  pPVar2 = local_18;
  pFVar1 = this->descriptor_;
  pOVar4 = Context::options(this->context_);
  java::Options::Options(&local_238,pOVar4);
  WriteFieldAccessorDocComment(pPVar2,pFVar1,CLEARER,&local_238,true,false,false);
  java::Options::~Options(&local_238);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_248,
             "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  $clear_has_field_bit_builder$\n"
            );
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_248);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_268,"}");
  pFVar1 = this->descriptor_;
  local_274 = kSet;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::
  optional<google::protobuf::io::AnnotationCollector::Semantic,_true>
            ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&type,&local_274);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_258,local_268,pFVar1,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)_type);
  local_278 = GetJavaType(this->descriptor_);
  pPVar2 = local_18;
  if ((local_278 == JAVATYPE_STRING) || (local_278 == JAVATYPE_BYTES)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_288,"  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_288);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_298,"  $name$_ = $default$;\n");
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_298);
  }
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_2a8,"  $on_changed$\n  return this;\n}\n");
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_2a8);
  return;
}

Assistant:

void ImmutablePrimitiveFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  printer->Print(variables_, "private $field_type$ $name$_ $default_init$;\n");

  if (descriptor_->has_presence()) {
    WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                                 context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
        "  return $get_has_field_bit_builder$;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$set$capitalized_name$$}$($type$ value) {\n"
                 "  $null_check$\n"
                 "  $name$_ = value;\n"
                 "  $set_has_field_bit_builder$\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  $clear_has_field_bit_builder$\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  JavaType type = GetJavaType(descriptor_);
  if (type == JAVATYPE_STRING || type == JAVATYPE_BYTES) {
    // The default value is not a simple literal so we want to avoid executing
    // it multiple times.  Instead, get the default out of the default instance.
    printer->Print(
        variables_,
        "  $name$_ = getDefaultInstance().get$capitalized_name$();\n");
  } else {
    printer->Print(variables_, "  $name$_ = $default$;\n");
  }
  printer->Print(variables_,
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}